

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::_PathArcToN
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  int in_EDX;
  float *in_RSI;
  float in_XMM0_Da;
  float fVar1;
  float _x;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float a;
  int i;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float fVar3;
  int in_stack_ffffffffffffffbc;
  ImVector<ImVec2> *in_stack_ffffffffffffffc0;
  ImVec2 local_30;
  float local_28;
  int local_24;
  int local_20;
  float local_1c;
  float local_18;
  float local_14;
  float *local_10;
  
  if (0.5 <= in_XMM0_Da) {
    local_20 = in_EDX;
    local_1c = in_XMM2_Da;
    local_18 = in_XMM1_Da;
    local_14 = in_XMM0_Da;
    local_10 = in_RSI;
    ImVector<ImVec2>::reserve(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    for (local_24 = 0; local_24 <= local_20; local_24 = local_24 + 1) {
      local_28 = ((float)local_24 / (float)local_20) * (local_1c - local_18) + local_18;
      fVar3 = *local_10;
      fVar1 = cosf(local_28);
      _x = fVar1 * local_14 + fVar3;
      fVar1 = local_10[1];
      fVar2 = sinf(local_28);
      ImVec2::ImVec2(&local_30,_x,fVar2 * local_14 + fVar1);
      ImVector<ImVec2>::push_back
                ((ImVector<ImVec2> *)CONCAT44(fVar3,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  }
  else {
    ImVector<ImVec2>::push_back
              ((ImVector<ImVec2> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToN(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}